

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

void __thiscall lf::uscalfe::test::lf_full_bd_a_3_Test::TestBody(lf_full_bd_a_3_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  char *message;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:317:7)>
  *in_R8;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:317:7)>
  local_80;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:314:7)>
  local_70;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> en;
  undefined1 local_40 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:317:7)>
  eta;
  undefined1 local_28 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:314:7)>
  v;
  int reflevels;
  lf_full_bd_a_3_Test *this_local;
  
  v._12_4_ = 6;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "<<<< TEST: Boundary energy test 3, f = exp(x*y) >>>>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"eta = x^2+y^2 => energy = 9.58358..");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:314:7)>
  ::MeshFunctionGlobal();
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:317:7)>
  ::MeshFunctionGlobal();
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:314:7)>
  ::MeshFunctionGlobal
            (&local_70,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:314:7)>
              *)local_28);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:317:7)>
  ::MeshFunctionGlobal
            (&local_80,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:317:7)>
              *)local_40);
  LinFEInterfaceEnergyTest<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_3_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_3_Test::TestBody()::__1>>
            ((vector<double,_std::allocator<double>_> *)local_60,(test *)0x6,(int)&local_70,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:314:7)>
              *)&local_80,in_R8);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:317:7)>
  ::~MeshFunctionGlobal(&local_80);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:314:7)>
  ::~MeshFunctionGlobal(&local_70);
  pvVar3 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)local_60);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a0,"en.back()","9.58358","1.0E-3",*pvVar3,9.58358,0.001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc"
               ,0x140,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  return;
}

Assistant:

TEST(lf_full, bd_a_3) {
  // Four levels of refinement
  const int reflevels = REFLEV;
  std::cout << "<<<< TEST: Boundary energy test 3, f = exp(x*y) >>>>"
            << std::endl;

  std::cout << "eta = x^2+y^2 => energy = 9.58358.." << std::endl;
  // Synthetic function
  auto v = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return std::exp(x[0] * x[1]); });
  // Impedance coefficient
  auto eta = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (x[0] * x[0] + x[1] * x[1]); });

  auto en{LinFEInterfaceEnergyTest(reflevels, v, eta)};
  EXPECT_NEAR(en.back(), 9.58358, 1.0E-3);
}